

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TextureSwizzle::SmokeTest::isTargetSuppByFormat
          (SmokeTest *this,size_t format_idx,size_t target_idx)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = (&DAT_01e83404)[format_idx * 0x1e];
  bVar2 = true;
  if ((2 < iVar1 - 0x81a5U) && (1 < iVar1 - 0x8cacU)) {
    if (iVar1 == 0x8c3d) {
      return (*(uint *)(texture_targets + target_idx * 0x30 + 0x28) & 0xfffffffd) != 0x9100;
    }
    if (iVar1 != 0x88f0) {
      return true;
    }
  }
  iVar1 = *(int *)(texture_targets + target_idx * 0x30 + 0x28);
  if (((iVar1 == 0x806f) || (iVar1 == 0x9102)) || (iVar1 == 0x9100)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SmokeTest::isTargetSuppByFormat(size_t format_idx, size_t target_idx)
{
	const _texture_format& format		 = texture_formats[format_idx];
	const _texture_target& source_target = texture_targets[target_idx];

	bool is_supported = true;

	switch (format.m_internal_format)
	{
	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH24_STENCIL8:
	case GL_DEPTH32F_STENCIL8:
		switch (source_target.m_target)
		{
		case GL_TEXTURE_3D:
		case GL_TEXTURE_2D_MULTISAMPLE:
		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			is_supported = false;
			break;
		default:
			break;
		}
		break;

	case GL_RGB9_E5:
		switch (source_target.m_target)
		{
		case GL_TEXTURE_2D_MULTISAMPLE:
		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			is_supported = false;
			break;
		default:
			break;
		}
		break;

	default:
		break;
	}

	return is_supported;
}